

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<std::complex<long_double>_>::SolveSOR
          (TPZMatrix<std::complex<long_double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<long_double>_> *F,TPZFMatrix<std::complex<long_double>_> *result,
          TPZFMatrix<std::complex<long_double>_> *residual,
          TPZFMatrix<std::complex<long_double>_> *param_5,REAL overrelax,REAL *tol,int FromCurrent,
          int direction)

{
  longdouble lVar1;
  int iVar2;
  int extraout_var;
  complex<long_double> *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long row;
  long lVar8;
  TPZFMatrix<std::complex<long_double>_> *A;
  int64_t j;
  long row_00;
  int64_t ic;
  long col;
  bool bVar9;
  longdouble in_ST0;
  longdouble lVar10;
  longdouble lVar11;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar12;
  longdouble lVar13;
  longdouble in_ST3;
  longdouble in_ST4;
  complex<long_double> __r;
  complex<long_double> res;
  complex<long_double> eqres;
  complex<long_double> __r_4;
  complex<long_double> local_58;
  long lVar3;
  
  if (residual == F) {
    std::operator<<((ostream *)&std::cout,
                    "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
    return;
  }
  lVar10 = (longdouble)*tol;
  eqres._M_value._0_4_ = SUB104(lVar10,0);
  eqres._M_value._4_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
  eqres._M_value._8_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
  eqres._M_value._16_8_ = SUB108((longdouble)0,0);
  eqres._M_value._24_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
  lVar10 = (longdouble)2.0;
  __r._M_value._0_4_ = SUB104(lVar10,0);
  __r._M_value._4_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
  __r._M_value._8_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
  A = (TPZFMatrix<std::complex<long_double>_> *)&eqres;
  __r._M_value._16_8_ = eqres._M_value._16_8_;
  __r._M_value._24_2_ = eqres._M_value._24_2_;
  std::complex<long_double>::operator*=(&__r,(complex<long_double> *)A);
  res._M_value._10_2_ = __r._M_value._10_2_;
  res._M_value._12_4_ = __r._M_value._12_4_;
  lVar12 = (longdouble)1 +
           (longdouble)CONCAT28(__r._M_value._8_2_,CONCAT44(__r._M_value._4_4_,__r._M_value._0_4_));
  lVar10 = (longdouble)0 + (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
  res._M_value._0_4_ = SUB104(lVar12,0);
  res._M_value._4_4_ = SUB104((unkuint10)lVar12 >> 0x20,0);
  res._M_value._8_2_ = SUB102((unkuint10)lVar12 >> 0x40,0);
  res._M_value._16_8_ = SUB108(lVar10,0);
  res._M_value._24_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
  lVar10 = in_ST0;
  lVar12 = in_ST4;
  if (residual != (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    lVar10 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    Norm((longdouble *)residual,A);
    res._M_value._0_4_ = SUB104(in_ST0,0);
    res._M_value._4_4_ = SUB104((unkuint10)in_ST0 >> 0x20,0);
    res._M_value._8_2_ = SUB102((unkuint10)in_ST0 >> 0x40,0);
    res._M_value._16_8_ = SUB108((longdouble)0,0);
    res._M_value._24_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
  lVar3 = CONCAT44(extraout_var,iVar2);
  lVar5 = (F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  lVar8 = 0;
  bVar9 = direction != -1;
  lVar6 = lVar3 + -1;
  if (bVar9) {
    lVar6 = lVar8;
  }
  lVar7 = -1;
  if (bVar9) {
    lVar7 = lVar3;
  }
  lVar13 = (longdouble)0;
  eqres._M_value._0_4_ = SUB104(lVar13,0);
  eqres._M_value._4_4_ = SUB104((unkuint10)lVar13 >> 0x20,0);
  eqres._M_value._8_2_ = SUB102((unkuint10)lVar13 >> 0x40,0);
  eqres._M_value._16_8_ = SUB108(lVar13,0);
  if (lVar3 == 0 || extraout_var < 0) {
    lVar3 = lVar8;
  }
  lVar13 = lVar12;
  eqres._M_value._24_2_ = eqres._M_value._8_2_;
  if (lVar5 < 1) {
    lVar5 = lVar8;
  }
  for (; lVar11 = lVar10, lVar8 < *numiterations; lVar8 = lVar8 + 1) {
    __r._M_value._16_8_ = res._M_value._16_8_;
    __r._M_value._24_2_ = res._M_value._24_2_;
    __r._M_value._0_4_ = res._M_value._0_4_;
    __r._M_value._4_4_ = res._M_value._4_4_;
    __r._M_value._8_2_ = res._M_value._8_2_;
    __r._M_value._10_2_ = res._M_value._10_2_;
    __r._M_value._12_4_ = res._M_value._12_4_;
    std::abs<long_double>((longdouble *)&__r,(complex<long_double> *)A);
    lVar1 = (longdouble)0;
    lVar11 = in_ST1;
    if (ABS((double)lVar10) <= ABS(*tol)) break;
    res._M_value._0_4_ = SUB104(lVar1,0);
    res._M_value._4_4_ = SUB104((unkuint10)lVar1 >> 0x20,0);
    res._M_value._8_2_ = SUB102((unkuint10)lVar1 >> 0x40,0);
    res._M_value._16_8_ = SUB108(lVar1,0);
    lVar11 = lVar13;
    res._M_value._24_2_ = res._M_value._8_2_;
    for (col = 0; row = lVar6, col != lVar5; col = col + 1) {
      for (; row != lVar7; row = row + (ulong)bVar9 * 2 + -1) {
        (*(F->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(&__r,F,row,col);
        eqres._M_value._16_8_ = __r._M_value._16_8_;
        eqres._M_value._24_2_ = __r._M_value._24_2_;
        eqres._M_value._0_4_ = __r._M_value._0_4_;
        eqres._M_value._4_4_ = __r._M_value._4_4_;
        eqres._M_value._8_2_ = __r._M_value._8_2_;
        eqres._M_value._10_2_ = __r._M_value._10_2_;
        eqres._M_value._12_4_ = __r._M_value._12_4_;
        for (row_00 = 0; lVar3 != row_00; row_00 = row_00 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&__r_4,this,row,row_00);
          pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(result,row_00,col);
          __r._M_value._0_4_ = __r_4._M_value._0_4_;
          __r._M_value._4_4_ = __r_4._M_value._4_4_;
          __r._M_value._8_2_ = __r_4._M_value._8_2_;
          __r._M_value._10_2_ = __r_4._M_value._10_2_;
          __r._M_value._12_4_ = __r_4._M_value._12_4_;
          __r._M_value._16_8_ = __r_4._M_value._16_8_;
          __r._M_value._24_2_ = __r_4._M_value._24_2_;
          std::complex<long_double>::operator*=(&__r,pcVar4);
          lVar13 = (longdouble)
                   CONCAT28(eqres._M_value._8_2_,CONCAT44(eqres._M_value._4_4_,eqres._M_value._0_4_)
                           ) -
                   (longdouble)
                   CONCAT28(__r._M_value._8_2_,CONCAT44(__r._M_value._4_4_,__r._M_value._0_4_));
          lVar10 = (longdouble)CONCAT28(eqres._M_value._24_2_,eqres._M_value._16_8_) -
                   (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
          eqres._M_value._0_4_ = SUB104(lVar13,0);
          eqres._M_value._4_4_ = SUB104((unkuint10)lVar13 >> 0x20,0);
          eqres._M_value._8_2_ = SUB102((unkuint10)lVar13 >> 0x40,0);
          eqres._M_value._16_8_ = SUB108(lVar10,0);
          eqres._M_value._24_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
        }
        __r._M_value._16_8_ = eqres._M_value._16_8_;
        __r._M_value._24_2_ = eqres._M_value._24_2_;
        __r._M_value._0_4_ = eqres._M_value._0_4_;
        __r._M_value._4_4_ = eqres._M_value._4_4_;
        __r._M_value._8_2_ = eqres._M_value._8_2_;
        __r._M_value._10_2_ = eqres._M_value._10_2_;
        __r._M_value._12_4_ = eqres._M_value._12_4_;
        std::complex<long_double>::operator*=(&__r,&eqres);
        lVar13 = (longdouble)
                 CONCAT28(res._M_value._8_2_,CONCAT44(res._M_value._4_4_,res._M_value._0_4_)) +
                 (longdouble)
                 CONCAT28(__r._M_value._8_2_,CONCAT44(__r._M_value._4_4_,__r._M_value._0_4_));
        lVar10 = (longdouble)CONCAT28(res._M_value._24_2_,res._M_value._16_8_) +
                 (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
        res._M_value._0_4_ = SUB104(lVar13,0);
        res._M_value._4_4_ = SUB104((unkuint10)lVar13 >> 0x20,0);
        res._M_value._8_2_ = SUB102((unkuint10)lVar13 >> 0x40,0);
        res._M_value._16_8_ = SUB108(lVar10,0);
        res._M_value._24_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
        __r_4._M_value._0_8_ = SUB108((longdouble)overrelax,0);
        __r_4._M_value._8_2_ = SUB102((unkuint10)(longdouble)overrelax >> 0x40,0);
        __r_4._M_value._16_8_ = SUB108((longdouble)0,0);
        __r_4._M_value._24_2_ = SUB102((unkuint10)(longdouble)0 >> 0x40,0);
        std::complex<long_double>::operator*=(&__r_4,&eqres);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_58,this,row,row);
        __r._M_value._16_8_ = __r_4._M_value._16_8_;
        __r._M_value._24_2_ = __r_4._M_value._24_2_;
        __r._M_value._0_4_ = __r_4._M_value._0_4_;
        __r._M_value._4_4_ = __r_4._M_value._4_4_;
        __r._M_value._8_2_ = __r_4._M_value._8_2_;
        __r._M_value._10_2_ = __r_4._M_value._10_2_;
        __r._M_value._12_4_ = __r_4._M_value._12_4_;
        std::complex<long_double>::operator/=(&__r,&local_58);
        pcVar4 = TPZFMatrix<std::complex<long_double>_>::operator()(result,row,col);
        lVar10 = *(longdouble *)(pcVar4->_M_value + 0x10);
        *(longdouble *)pcVar4->_M_value =
             *(longdouble *)pcVar4->_M_value +
             (longdouble)
             CONCAT28(__r._M_value._8_2_,CONCAT44(__r._M_value._4_4_,__r._M_value._0_4_));
        *(longdouble *)(pcVar4->_M_value + 0x10) =
             lVar10 + (longdouble)CONCAT28(__r._M_value._24_2_,__r._M_value._16_8_);
        lVar13 = lVar12;
        lVar11 = lVar12;
      }
    }
    A = (TPZFMatrix<std::complex<long_double>_> *)&res;
    std::sqrt<long_double>(&__r,(complex<long_double> *)A);
    res._M_value._0_4_ = __r._M_value._0_4_;
    res._M_value._4_4_ = __r._M_value._4_4_;
    res._M_value._12_4_ = __r._M_value._12_4_;
    res._M_value._16_8_ = __r._M_value._16_8_;
    res._M_value._24_2_ = __r._M_value._24_2_;
    res._M_value._8_2_ = __r._M_value._8_2_;
    res._M_value._10_2_ = __r._M_value._10_2_;
    lVar10 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = lVar12;
    lVar12 = lVar13;
    lVar13 = lVar11;
  }
  if (residual != (TPZFMatrix<std::complex<long_double>_> *)0x0) {
    (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])(this,result,F);
    A = result;
  }
  *numiterations = lVar8;
  __r._M_value._16_8_ = res._M_value._16_8_;
  __r._M_value._24_2_ = res._M_value._24_2_;
  __r._M_value._0_4_ = res._M_value._0_4_;
  __r._M_value._4_4_ = res._M_value._4_4_;
  __r._M_value._8_2_ = res._M_value._8_2_;
  __r._M_value._10_2_ = res._M_value._10_2_;
  __r._M_value._12_4_ = res._M_value._12_4_;
  std::abs<long_double>((longdouble *)&__r,(complex<long_double> *)A);
  *tol = ABS((double)lVar11);
  return;
}

Assistant:

void TPZMatrix<TVar>::SolveSOR(int64_t & numiterations, const TPZFMatrix<TVar> &F,
							   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/, const REAL overrelax,
							   REAL &tol,const int FromCurrent,const int direction) {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	TVar res = (TVar)2*(TVar)tol+(TVar)1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
	int64_t r = Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	int64_t it;
	if(direction == -1) {
		ifirst = r-1;  //misael
		ilast = -1;
		iinc = -1;
	}
	TVar eqres;
	for(it=0; it<numiterations && (REAL)(fabs(res)) > fabs(tol); it++) {
		res = 0.;
		for(int64_t ic=0; ic<c; ic++) {
			for(i=ifirst; i!=ilast; i+= iinc) {
				eqres = F.GetVal(i,ic);
				for(int64_t j=0; j<r; j++) {
					eqres -= GetVal(i,j)*result(j,ic);
				}
				res += eqres*eqres;
				result(i,ic) += (TVar)overrelax*eqres/GetVal(i,i);
			}
		}
		res = sqrt(res);
	}
	if(residual) Residual(result,F,*residual);
	numiterations = it;
	tol = fabs(res);
}